

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

void __thiscall
Model_removeComponentInsensitiveToOrder_Test::Model_removeComponentInsensitiveToOrder_Test
          (Model_removeComponentInsensitiveToOrder_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_001347d0;
  return;
}

Assistant:

TEST(Model, removeComponentInsensitiveToOrder)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"parsed_model\">\n"
        "  <component name=\"c1\">\n"
        "    <variable name=\"v1\" units=\"dimensionless\"/>\n"
        "  </component>\n"
        "  <component name=\"c2\">\n"
        "    <variable name=\"v2\" units=\"dimensionless\"/>\n"
        "  </component>\n"
        "</model>\n";

    auto parser = libcellml::Parser::create();
    auto modelParsed = parser->parseModel(e);
    auto modelApi = libcellml::Model::create("api_model");

    // I want to move a component from modelParsed to modelApi
    auto c1Parsed = modelParsed->component("c1");
    modelApi->addComponent(c1Parsed);
    // Expect one component each
    EXPECT_EQ(size_t(1), modelParsed->componentCount());
    EXPECT_EQ(size_t(1), modelApi->componentCount());

    // Remove it from the parsed model: this does nothing because the parent pointer
    // has already been changed when it was added to the modelApi
    modelParsed->removeComponent(c1Parsed);

    // Still expect one component each
    EXPECT_EQ(size_t(1), modelParsed->componentCount());
    EXPECT_EQ(size_t(1), modelApi->componentCount());

    // If the order of operations is switched the behaviour is the same:

    // Get a pointer to the second component in the parsed model.
    auto c2Parsed = modelParsed->component("c2");
    // Remove it from the parsed model.
    modelParsed->removeComponent(c2Parsed);
    // Add it to the api model.
    modelApi->addComponent(c2Parsed);

    EXPECT_EQ(size_t(0), modelParsed->componentCount());
    EXPECT_EQ(size_t(2), modelApi->componentCount());
}